

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XMLGrammarPoolImpl::cacheGrammar(XMLGrammarPoolImpl *this,Grammar *gramToCache)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ushort *key1;
  ulong uVar3;
  ushort *puVar4;
  ushort uVar5;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *this_00;
  RefHashTableBucketElem<xercesc_4_0::Grammar> *pRVar6;
  
  bVar1 = false;
  if ((gramToCache != (Grammar *)0x0) && (bVar1 = false, this->fLocked == false)) {
    iVar2 = (*(gramToCache->super_XSerializable)._vptr_XSerializable[0x16])(gramToCache);
    key1 = (ushort *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                     ((long *)CONCAT44(extraout_var,iVar2));
    this_00 = this->fGrammarRegistry;
    if ((key1 == (ushort *)0x0) || (uVar3 = (ulong)*key1, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      uVar5 = key1[1];
      if (uVar5 != 0) {
        puVar4 = key1 + 2;
        do {
          uVar3 = (ulong)uVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
          uVar5 = *puVar4;
          puVar4 = puVar4 + 1;
        } while (uVar5 != 0);
      }
      uVar3 = uVar3 % this_00->fHashModulus;
    }
    pRVar6 = this_00->fBucketList[uVar3];
    if (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) {
      do {
        bVar1 = StringHasher::equals((StringHasher *)&this_00->field_0x30,key1,pRVar6->fKey);
        if (bVar1) {
          return false;
        }
        pRVar6 = pRVar6->fNext;
      } while (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0);
      this_00 = this->fGrammarRegistry;
    }
    RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::put(this_00,key1,gramToCache);
    bVar1 = true;
    if ((this->fXSModelIsValid == true) &&
       (iVar2 = (*(gramToCache->super_XSerializable)._vptr_XSerializable[5])(gramToCache),
       iVar2 == 1)) {
      this->fXSModelIsValid = false;
    }
  }
  return bVar1;
}

Assistant:

bool XMLGrammarPoolImpl::cacheGrammar(Grammar* const               gramToCache )
{
    if(fLocked || !gramToCache)
        return false;

    const XMLCh* grammarKey = gramToCache->getGrammarDescription()->getGrammarKey();

    if (fGrammarRegistry->containsKey(grammarKey))
    {
        return false;
    }

    fGrammarRegistry->put((void*) grammarKey, gramToCache);

    if (fXSModelIsValid && gramToCache->getGrammarType() == Grammar::SchemaGrammarType)
    {
        fXSModelIsValid = false;
    }
    return true;
}